

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Unmarshall.c
# Opt level: O2

WJTL_STATUS TestUnmarshallListAlreadyHasContentsStrFixedArray(void)

{
  JL_STATUS JVar1;
  int iVar2;
  int iVar3;
  JL_STATUS JVar4;
  int iVar5;
  JL_STATUS JVar6;
  long lVar7;
  undefined8 *puVar8;
  JlMarshallElement *pJVar9;
  WJTL_STATUS WVar10;
  bool Condition;
  bool Condition_00;
  bool Condition_01;
  bool Condition_02;
  size_t errorAtPos;
  TheStruct theStruct;
  JlMarshallElement marshalTheStruct [1];
  
  errorAtPos = 0;
  puVar8 = &DAT_00141650;
  pJVar9 = marshalTheStruct;
  for (lVar7 = 0xc; lVar7 != 0; lVar7 = lVar7 + -1) {
    *(undefined8 *)pJVar9 = *puVar8;
    puVar8 = puVar8 + 1;
    pJVar9 = (JlMarshallElement *)&pJVar9->Name;
  }
  theStruct.StrFixList[2] = (char *)0x0;
  theStruct.StrFixList[3] = (char *)0x0;
  theStruct.StrFixList[0] = (char *)0x0;
  theStruct.StrFixList[1] = (char *)0x0;
  theStruct.StrFixListCount = 0;
  JVar1 = JlJsonToStruct("{\"Strs\":[\"aaa\",\"bbb\"]}",marshalTheStruct,1,&theStruct,&errorAtPos);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{\\\"Strs\\\":[\\\"aaa\\\",\\\"bbb\\\"]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContentsStrFixedArray",0x5a9);
  WVar10 = WJTL_STATUS_SUCCESS;
  Condition = errorAtPos == 0;
  WjTestLib_Assert(Condition,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContentsStrFixedArray",0x5aa);
  Condition_00 = theStruct.StrFixListCount == 2;
  WjTestLib_Assert(Condition_00,"2 == theStruct.StrFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContentsStrFixedArray",0x5ab);
  iVar2 = strcmp(theStruct.StrFixList[0],"aaa");
  WjTestLib_Assert(iVar2 == 0,"strcmp( theStruct.StrFixList[0], \"aaa\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContentsStrFixedArray",0x5ac);
  iVar3 = strcmp(theStruct.StrFixList[1],"bbb");
  WjTestLib_Assert(iVar3 == 0,"strcmp( theStruct.StrFixList[1], \"bbb\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContentsStrFixedArray",0x5ad);
  JVar4 = JlJsonToStruct("{\"Strs\":[\"ccc\"]}",marshalTheStruct,1,&theStruct,&errorAtPos);
  WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{\\\"Strs\\\":[\\\"ccc\\\"]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContentsStrFixedArray",0x5b0);
  Condition_01 = errorAtPos == 0;
  WjTestLib_Assert(Condition_01,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContentsStrFixedArray",0x5b1);
  Condition_02 = theStruct.StrFixListCount == 1;
  WjTestLib_Assert(Condition_02,"1 == theStruct.StrFixListCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContentsStrFixedArray",0x5b2);
  iVar5 = strcmp(theStruct.StrFixList[0],"ccc");
  WjTestLib_Assert(iVar5 == 0,"strcmp( theStruct.StrFixList[0], \"ccc\" ) == 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContentsStrFixedArray",0x5b3);
  JVar6 = JlUnmarshallFreeStructAllocs(marshalTheStruct,1,&theStruct);
  WjTestLib_Assert(JVar6 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlUnmarshallFreeStructAllocs( marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContentsStrFixedArray",0x5b6);
  if ((!Condition_02 || (!Condition_01 || JVar4 != JL_STATUS_SUCCESS)) ||
      ((!Condition_00 || !Condition) || ((iVar2 != 0 || JVar1 != JL_STATUS_SUCCESS) || iVar3 != 0)))
  {
    WVar10 = WJTL_STATUS_FAILED;
  }
  if (JVar6 != JL_STATUS_SUCCESS || iVar5 != 0) {
    WVar10 = WJTL_STATUS_FAILED;
  }
  return WVar10;
}

Assistant:

static
WJTL_STATUS
    TestUnmarshallListAlreadyHasContentsStrFixedArray
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;
    size_t errorAtPos = 0;

    typedef struct
    {
        char*       StrFixList [4];
        size_t      StrFixListCount;
    } TheStruct;

    JlMarshallElement marshalTheStruct[] = {
        JlMarshallStringFixedArray( TheStruct, StrFixList, StrFixListCount, "Strs" )
    };

    TheStruct theStruct = {{0}};

    // Fill in struct with values
    JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"Strs\":[\"aaa\",\"bbb\"]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
    JL_ASSERT( 0 == errorAtPos );
    JL_ASSERT( 2 == theStruct.StrFixListCount );
    JL_ASSERT( strcmp( theStruct.StrFixList[0], "aaa" ) == 0 );
    JL_ASSERT( strcmp( theStruct.StrFixList[1], "bbb" ) == 0 );

    // Now unmarshall again when struct already has a list with contents.
    JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"Strs\":[\"ccc\"]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
    JL_ASSERT( 0 == errorAtPos );
    JL_ASSERT( 1 == theStruct.StrFixListCount );
    JL_ASSERT( strcmp( theStruct.StrFixList[0], "ccc" ) == 0 );

    // Free and make sure no memory leak
    JL_ASSERT_SUCCESS( JlUnmarshallFreeStructAllocs( marshalTheStruct, NumElements(marshalTheStruct), &theStruct ) );

    return TestReturn;
}